

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

ostream * doctest::detail::tlssPush(void)

{
  long lVar1;
  iterator __position;
  long *in_FS_OFFSET;
  fpos<__mbstate_t> local_20;
  
  g_infoContexts::__tls_init();
  lVar1 = *in_FS_OFFSET;
  local_20 = (fpos<__mbstate_t>)std::ostream::tellp();
  __position._M_current = (fpos<__mbstate_t> *)in_FS_OFFSET[-0x47];
  if (__position._M_current == (fpos<__mbstate_t> *)in_FS_OFFSET[-0x46]) {
    std::vector<std::fpos<__mbstate_t>,std::allocator<std::fpos<__mbstate_t>>>::
    _M_realloc_insert<std::fpos<__mbstate_t>>
              ((vector<std::fpos<__mbstate_t>,std::allocator<std::fpos<__mbstate_t>>> *)
               (lVar1 + -0x240),__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    in_FS_OFFSET[-0x47] = in_FS_OFFSET[-0x47] + 0x10;
  }
  return (ostream *)(lVar1 + -0x218);
}

Assistant:

std::ostream* tlssPush() {
        return g_oss.push();
    }